

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void functionDestroy(sqlite3 *db,FuncDef *p)

{
  if ((p != (FuncDef *)0x0) && (*(int *)p = *(int *)p + -1, *(int *)p == 0)) {
    (*(code *)p->pUserData)(p->pNext);
    sqlite3DbFreeNN(db,p);
    return;
  }
  return;
}

Assistant:

static void functionDestroy(sqlite3 *db, FuncDef *p){
  FuncDestructor *pDestructor;
  assert( (p->funcFlags & SQLITE_FUNC_BUILTIN)==0 );
  pDestructor = p->u.pDestructor;
  if( pDestructor ){
    pDestructor->nRef--;
    if( pDestructor->nRef==0 ){
      pDestructor->xDestroy(pDestructor->pUserData);
      sqlite3DbFree(db, pDestructor);
    }
  }
}